

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireAnalyzerSettings.cpp
# Opt level: O3

void __thiscall OneWireAnalyzerSettings::LoadSettings(OneWireAnalyzerSettings *this,char *settings)

{
  int iVar1;
  SimpleArchive text_archive;
  char *name_string;
  SimpleArchive aSStack_28 [8];
  char *local_20;
  
  SimpleArchive::SimpleArchive(aSStack_28);
  SimpleArchive::SetString((char *)aSStack_28);
  SimpleArchive::operator>>(aSStack_28,&local_20);
  iVar1 = strcmp(local_20,"SaleaeOneWireAnalyzer");
  if (iVar1 != 0) {
    AnalyzerHelpers::Assert
              ("SaleaeOneWireAnalyzer: Provided with a settings string that doesn\'t belong to us;")
    ;
  }
  SimpleArchive::operator>>(aSStack_28,&this->mOneWireChannel);
  SimpleArchive::operator>>(aSStack_28,&this->mOverdrive);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mOneWireChannel,true);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mOneWireChannelInterface)._M_ptr);
  AnalyzerSettingInterfaceBool::SetValue(SUB81((this->mOverDriveInterface)._M_ptr,0));
  SimpleArchive::~SimpleArchive(aSStack_28);
  return;
}

Assistant:

void OneWireAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeOneWireAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeOneWireAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mOneWireChannel;
    text_archive >> mOverdrive;

    ClearChannels();
    AddChannel( mOneWireChannel, "1-WIRE", true );

    UpdateInterfacesFromSettings();
}